

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

CalculatedFloat
absl::anon_unknown_0::CalculateFromParsedHexadecimal<double>(ParsedFloat *parsed_hex)

{
  int iVar1;
  anon_unknown_0 *this;
  long lVar2;
  uint uVar3;
  uint64_t mantissa;
  uint uVar4;
  Nonnull<bool_*> in_R9;
  CalculatedFloat CVar5;
  bool result_exact;
  
  this = (anon_unknown_0 *)parsed_hex->mantissa;
  iVar1 = parsed_hex->exponent;
  if (this == (anon_unknown_0 *)0x0) {
    uVar3 = 0x40;
  }
  else {
    lVar2 = 0x3f;
    if (this != (anon_unknown_0 *)0x0) {
      for (; (ulong)this >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (uint)lVar2 ^ 0x3f;
  }
  uVar4 = -iVar1 - 0x432;
  if ((int)uVar4 < (int)(0xb - uVar3)) {
    uVar4 = 0xb - uVar3;
  }
  mantissa = ShiftRightAndRound(this,(uint128)(ZEXT416(uVar4) << 0x40),1,true,in_R9);
  CVar5 = CalculatedFloatFromRawValues<double>(mantissa,iVar1 + uVar4);
  return CVar5;
}

Assistant:

CalculatedFloat CalculateFromParsedHexadecimal(
    const strings_internal::ParsedFloat& parsed_hex) {
  uint64_t mantissa = parsed_hex.mantissa;
  int exponent = parsed_hex.exponent;
  // This static_cast is only needed when using a std::bit_width()
  // implementation that does not have the fix for LWG 3656 applied.
  int mantissa_width = static_cast<int>(bit_width(mantissa));
  const int shift = NormalizedShiftSize<FloatType>(mantissa_width, exponent);
  bool result_exact;
  exponent += shift;
  mantissa = ShiftRightAndRound(mantissa, shift,
                                /* input exact= */ true, &result_exact);
  // ParseFloat handles rounding in the hexadecimal case, so we don't have to
  // check `result_exact` here.
  return CalculatedFloatFromRawValues<FloatType>(mantissa, exponent);
}